

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O2

void __thiscall Lodtalk::StackMemory::StackMemory(StackMemory *this,VMContext *context)

{
  uint8_t *puVar1;
  StackPage *pSVar2;
  long lVar3;
  StackPage *page;
  
  this->context = context;
  (this->stackPages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stackPages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stackPages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->freePages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->freePages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->freePages).super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stackFrame).framePointer = (uint8_t *)0x0;
  (this->stackFrame).stackPointer = (uint8_t *)0x0;
  this->stackSize = 0x20000;
  puVar1 = (uint8_t *)operator_new__(0x20000);
  this->stackMemoryLowest = puVar1;
  this->stackMemoryHighest = puVar1 + 0x20000;
  for (lVar3 = 0; lVar3 != 0x20000; lVar3 = lVar3 + 0x2000) {
    pSVar2 = (StackPage *)operator_new(0x58);
    StackPage::StackPage(pSVar2,context,this->stackMemoryLowest + lVar3);
    page = pSVar2;
    std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::push_back
              (&this->stackPages,&page);
    std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::push_back
              (&this->freePages,&page);
  }
  pSVar2 = allocatePage(this);
  this->currentPage = pSVar2;
  puVar1 = pSVar2->stackPageHighest;
  pSVar2->baseFramePointer = puVar1;
  (pSVar2->headFrame).framePointer = (uint8_t *)0x0;
  (pSVar2->headFrame).stackPointer = puVar1;
  puVar1 = (this->currentPage->headFrame).stackPointer;
  (this->stackFrame).framePointer = (this->currentPage->headFrame).framePointer;
  (this->stackFrame).stackPointer = puVar1;
  return;
}

Assistant:

StackMemory::StackMemory(VMContext *context)
    : context(context)
{
    stackSize = StackMemoryPageSize*StackPageCount;
    stackMemoryLowest = new uint8_t[stackSize];
    stackMemoryHighest = stackMemoryLowest + stackSize;

    for (size_t i = 0; i < StackPageCount; ++i)
    {
        auto page = new StackPage(context, stackMemoryLowest + i*StackMemoryPageSize);
        stackPages.push_back(page);
        freePages.push_back(page);
    }

    currentPage = allocatePage();
    currentPage->startUsing();
    stackFrame = currentPage->headFrame;
}